

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O0

void Cof_ManPrintFanio(Cof_Man_t *p)

{
  int iVar1;
  int iVar2;
  int i_00;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  bool bVar3;
  double dVar4;
  double dVar5;
  int local_e0;
  int local_d4;
  int local_cc;
  int nMffcNodes;
  int nSizeMax;
  int k;
  int i;
  int nMffcsAll;
  int nFanoutsAll;
  int nFaninsAll;
  int nMffcsMax;
  int nFanoutsMax;
  int nFaninsMax;
  int nMffcs;
  int nFanouts;
  int nFanins;
  Vec_Int_t *vMffcs;
  Vec_Int_t *vFanouts;
  Vec_Int_t *vFanins;
  Cof_Obj_t *pNode;
  char Buffer [100];
  Cof_Man_t *p_local;
  
  local_cc = 0;
  nFanoutsAll = 0;
  nFaninsAll = 0;
  nMffcsMax = 0;
  k = 0;
  i = 0;
  nMffcsAll = 0;
  nSizeMax = 0;
  unique0x10000797 = p;
  while( true ) {
    bVar3 = false;
    if (nSizeMax < stack0xfffffffffffffff0->nObjData) {
      vFanins = (Vec_Int_t *)Cof_ManObj(stack0xfffffffffffffff0,nSizeMax);
      bVar3 = (Cof_Obj_t *)vFanins != (Cof_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar1 = Cof_ObjIsTerm((Cof_Obj_t *)vFanins);
    if ((iVar1 == 0) && (nSizeMax != 0)) {
      iVar1 = Cof_ObjFaninNum((Cof_Obj_t *)vFanins);
      iVar2 = Cof_ObjFanoutNum((Cof_Obj_t *)vFanins);
      if ((uint)vFanins->nCap >> 8 < 2) {
        local_d4 = 0;
      }
      else {
        local_d4 = Cof_ObjMffcSize((Cof_Obj_t *)vFanins);
      }
      nMffcsAll = iVar1 + nMffcsAll;
      i = iVar2 + i;
      k = local_d4 + k;
      nMffcsMax = Abc_MaxInt(nMffcsMax,iVar1);
      nFaninsAll = Abc_MaxInt(nFaninsAll,iVar2);
      nFanoutsAll = Abc_MaxInt(nFanoutsAll,local_d4);
    }
    iVar1 = Cof_ObjSize((Cof_Obj_t *)vFanins);
    nSizeMax = iVar1 + nSizeMax;
  }
  iVar1 = Abc_Base10Log(nMffcsMax);
  iVar2 = Abc_Base10Log(nFaninsAll);
  iVar1 = Abc_MaxInt((iVar1 + 1) * 10,(iVar2 + 1) * 10);
  iVar2 = Abc_Base10Log(nFanoutsAll);
  iVar1 = Abc_MaxInt((iVar2 + 1) * 10,iVar1);
  p_00 = Vec_IntStart(iVar1);
  p_01 = Vec_IntStart(iVar1);
  p_02 = Vec_IntStart(iVar1);
  nSizeMax = 0;
  while( true ) {
    bVar3 = false;
    if (nSizeMax < stack0xfffffffffffffff0->nObjData) {
      vFanins = (Vec_Int_t *)Cof_ManObj(stack0xfffffffffffffff0,nSizeMax);
      bVar3 = (Cof_Obj_t *)vFanins != (Cof_Obj_t *)0x0;
    }
    if (!bVar3) break;
    iVar2 = Cof_ObjIsTerm((Cof_Obj_t *)vFanins);
    if ((iVar2 == 0) && (nSizeMax != 0)) {
      iVar2 = Cof_ObjFaninNum((Cof_Obj_t *)vFanins);
      i_00 = Cof_ObjFanoutNum((Cof_Obj_t *)vFanins);
      if ((uint)vFanins->nCap >> 8 < 2) {
        local_e0 = 0;
      }
      else {
        local_e0 = Cof_ObjMffcSize((Cof_Obj_t *)vFanins);
      }
      if (iVar2 < 10) {
        Vec_IntAddToEntry(p_00,iVar2,1);
      }
      else if (iVar2 < 100) {
        Vec_IntAddToEntry(p_00,iVar2 / 10 + 10,1);
      }
      else if (iVar2 < 1000) {
        Vec_IntAddToEntry(p_00,iVar2 / 100 + 0x14,1);
      }
      else if (iVar2 < 10000) {
        Vec_IntAddToEntry(p_00,iVar2 / 1000 + 0x1e,1);
      }
      else if (iVar2 < 100000) {
        Vec_IntAddToEntry(p_00,iVar2 / 10000 + 0x28,1);
      }
      else if (iVar2 < 1000000) {
        Vec_IntAddToEntry(p_00,iVar2 / 100000 + 0x32,1);
      }
      else if (iVar2 < 10000000) {
        Vec_IntAddToEntry(p_00,iVar2 / 1000000 + 0x3c,1);
      }
      if (i_00 < 10) {
        Vec_IntAddToEntry(p_01,i_00,1);
      }
      else if (i_00 < 100) {
        Vec_IntAddToEntry(p_01,i_00 / 10 + 10,1);
      }
      else if (i_00 < 1000) {
        Vec_IntAddToEntry(p_01,i_00 / 100 + 0x14,1);
      }
      else if (i_00 < 10000) {
        Vec_IntAddToEntry(p_01,i_00 / 1000 + 0x1e,1);
      }
      else if (i_00 < 100000) {
        Vec_IntAddToEntry(p_01,i_00 / 10000 + 0x28,1);
      }
      else if (i_00 < 1000000) {
        Vec_IntAddToEntry(p_01,i_00 / 100000 + 0x32,1);
      }
      else if (i_00 < 10000000) {
        Vec_IntAddToEntry(p_01,i_00 / 1000000 + 0x3c,1);
      }
      if (local_e0 != 0) {
        local_cc = local_cc + 1;
        if (local_e0 < 10) {
          Vec_IntAddToEntry(p_02,local_e0,1);
        }
        else if (local_e0 < 100) {
          Vec_IntAddToEntry(p_02,local_e0 / 10 + 10,1);
        }
        else if (local_e0 < 1000) {
          Vec_IntAddToEntry(p_02,local_e0 / 100 + 0x14,1);
        }
        else if (local_e0 < 10000) {
          Vec_IntAddToEntry(p_02,local_e0 / 1000 + 0x1e,1);
        }
        else if (local_e0 < 100000) {
          Vec_IntAddToEntry(p_02,local_e0 / 10000 + 0x28,1);
        }
        else if (local_e0 < 1000000) {
          Vec_IntAddToEntry(p_02,local_e0 / 100000 + 0x32,1);
        }
        else if (local_e0 < 10000000) {
          Vec_IntAddToEntry(p_02,local_e0 / 1000000 + 0x3c,1);
        }
      }
    }
    iVar2 = Cof_ObjSize((Cof_Obj_t *)vFanins);
    nSizeMax = iVar2 + nSizeMax;
  }
  printf("The distribution of fanins, fanouts. and MFFCs in the network:\n");
  printf("         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC\n");
  for (nMffcNodes = 0; nMffcNodes < iVar1; nMffcNodes = nMffcNodes + 1) {
    if (((p_00->pArray[nMffcNodes] != 0) || (p_01->pArray[nMffcNodes] != 0)) ||
       (p_02->pArray[nMffcNodes] != 0)) {
      if (nMffcNodes < 10) {
        printf("%15d : ",(ulong)(uint)nMffcNodes);
      }
      else {
        dVar4 = pow(10.0,(double)(nMffcNodes / 10));
        dVar5 = pow(10.0,(double)(nMffcNodes / 10));
        sprintf((char *)&pNode,"%d - %d",(ulong)(uint)((int)dVar4 * (nMffcNodes % 10)),
                (ulong)((int)dVar5 * (nMffcNodes % 10 + 1) - 1));
        printf("%15s : ",&pNode);
      }
      if (p_00->pArray[nMffcNodes] == 0) {
        printf("              ");
      }
      else {
        printf("%11d   ",(ulong)(uint)p_00->pArray[nMffcNodes]);
      }
      printf("    ");
      if (p_01->pArray[nMffcNodes] == 0) {
        printf("              ");
      }
      else {
        printf("%12d  ",(ulong)(uint)p_01->pArray[nMffcNodes]);
      }
      printf("    ");
      if (p_02->pArray[nMffcNodes] == 0) {
        printf("               ");
      }
      else {
        printf("  %12d  ",(ulong)(uint)p_02->pArray[nMffcNodes]);
      }
      printf("\n");
    }
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  iVar1 = Cof_ManNodeNum(stack0xfffffffffffffff0);
  iVar2 = Cof_ManNodeNum(stack0xfffffffffffffff0);
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n"
         ,((double)nMffcsAll * 1.0) / (double)iVar1,((double)i * 1.0) / (double)iVar2,
         ((double)k * 1.0) / (double)local_cc,(ulong)(uint)nMffcsMax,(ulong)(uint)nFaninsAll,
         (ulong)(uint)nFanoutsAll);
  return;
}

Assistant:

void Cof_ManPrintFanio( Cof_Man_t * p )
{
    char Buffer[100];
    Cof_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts, * vMffcs;
    int nFanins, nFanouts, nMffcs, nFaninsMax, nFanoutsMax, nMffcsMax, nFaninsAll, nFanoutsAll, nMffcsAll;
    int i, k, nSizeMax, nMffcNodes = 0;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = nMffcsMax = 0;
    nFaninsAll = nFanoutsAll = nMffcsAll = 0;
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nMffcsAll   += nMffcs;
        nFaninsMax   = Abc_MaxInt( nFaninsMax,  nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
        nMffcsMax    = Abc_MaxInt( nMffcsMax,   nMffcs );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nMffcsMax) + 1),  nSizeMax );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );
    vMffcs   = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Cof_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue;
        nFanins  = Cof_ObjFaninNum(pNode);
        nFanouts = Cof_ObjFanoutNum(pNode);
        nMffcs   = pNode->nFanouts > 1 ? Cof_ObjMffcSize(pNode) : 0;

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
       
        if ( nMffcs == 0 )
            continue;
        nMffcNodes++;

        if ( nMffcs < 10 )
            Vec_IntAddToEntry( vMffcs, nMffcs, 1 );
        else if ( nMffcs < 100 )
            Vec_IntAddToEntry( vMffcs, 10 + nMffcs/10, 1 );
        else if ( nMffcs < 1000 )
            Vec_IntAddToEntry( vMffcs, 20 + nMffcs/100, 1 );
        else if ( nMffcs < 10000 )
            Vec_IntAddToEntry( vMffcs, 30 + nMffcs/1000, 1 );
        else if ( nMffcs < 100000 )
            Vec_IntAddToEntry( vMffcs, 40 + nMffcs/10000, 1 );
        else if ( nMffcs < 1000000 )
            Vec_IntAddToEntry( vMffcs, 50 + nMffcs/100000, 1 );
        else if ( nMffcs < 10000000 )
            Vec_IntAddToEntry( vMffcs, 60 + nMffcs/1000000, 1 );
    }

    printf( "The distribution of fanins, fanouts. and MFFCs in the network:\n" );
    printf( "         Number    Nodes with fanin   Nodes with fanout   Nodes with MFFC\n" );

    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 && vMffcs->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%11d   ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "    " );
        if ( vMffcs->pArray[k] == 0 )
            printf( "               " );
        else
            printf( "  %12d  ", vMffcs->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );
    Vec_IntFree( vMffcs );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.  MFFCs: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll /Cof_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Cof_ManNodeNum(p), 
        nMffcsMax,   1.0*nMffcsAll  /nMffcNodes  );
}